

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyDeepScanLine.cpp
# Opt level: O3

void anon_unknown.dwarf_d2d1d::readCopyWriteTest(string *tempDir,int channelCount,int testTimes)

{
  long lVar1;
  float fVar2;
  PixelType PVar3;
  pointer pcVar4;
  size_t __n;
  PixelType PVar5;
  Array2D<void_*> *pAVar6;
  _Alloc_hider _Var7;
  char cVar8;
  ostream *poVar9;
  _Base_ptr size;
  string *psVar10;
  void *pvVar11;
  void *pvVar12;
  Header *pHVar13;
  undefined8 *puVar14;
  undefined8 *puVar15;
  float *pfVar16;
  float *pfVar17;
  int *piVar18;
  ChannelList *this;
  ChannelList *pCVar19;
  void *pvVar20;
  long *plVar21;
  undefined4 uVar22;
  int i;
  int iVar23;
  _Base_ptr p_Var24;
  ushort uVar25;
  uint uVar26;
  ushort uVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  int j_2;
  long lVar31;
  uint uVar32;
  int j_1;
  long lVar33;
  int j;
  long lVar34;
  long lVar35;
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int iVar41;
  int iVar42;
  DeepScanLineOutputFile file;
  Array2D<void_*> *local_328;
  uint local_314;
  int type;
  undefined4 uStack_2f4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2f0;
  _Base_ptr local_2e8;
  _Base_ptr local_2e0;
  _Base_ptr local_2d8;
  Array<Imf_3_4::Array2D<void_*>_> data;
  long local_2c0 [2];
  long local_2b0;
  string copy_filename;
  string source_filename;
  DeepFrameBuffer frameBuffer;
  Channel local_1f0 [56];
  stringstream ss;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1b0;
  undefined1 local_1a8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a0;
  ios_base aiStack_138 [264];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing files with ",0x13);
  poVar9 = (ostream *)std::ostream::operator<<(&std::cout,channelCount);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," channels ",10);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,testTimes);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," times.",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::ostream::flush();
  source_filename._M_dataplus._M_p = (pointer)&source_filename.field_2;
  pcVar4 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&source_filename,pcVar4,pcVar4 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)&source_filename);
  copy_filename._M_dataplus._M_p = (pointer)&copy_filename.field_2;
  pcVar4 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&copy_filename,pcVar4,pcVar4 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)&copy_filename);
  if (0 < testTimes) {
    size = (_Base_ptr)(ulong)(uint)channelCount;
    local_314 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"generating ",0xb);
      std::ostream::flush();
      frameBuffer._map._M_t._M_impl._0_8_ = 0;
      Imf_3_4::Header::Header
                ((Header *)&ss,(Box *)(anonymous_namespace)::displayWindow,
                 (Box *)&(anonymous_namespace)::dataWindow,1.0,(Vec2 *)&frameBuffer,1.0,INCREASING_Y
                 ,local_314 % 3);
      Imf_3_4::Header::operator=((Header *)(anonymous_namespace)::header,(Header *)&ss);
      Imf_3_4::Header::~Header((Header *)&ss);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compression ",0xc);
      poVar9 = (ostream *)std::ostream::operator<<(&std::cout,local_314 % 3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
      std::ostream::flush();
      if (DAT_001eb118._M_current != (anonymous_namespace)::channelTypes) {
        DAT_001eb118._M_current = (anonymous_namespace)::channelTypes;
      }
      if (0 < channelCount) {
        iVar23 = 0;
        do {
          type = random_int(3);
          std::__cxx11::stringstream::stringstream((stringstream *)&ss);
          std::ostream::operator<<(local_1a8,iVar23);
          std::__cxx11::stringbuf::str();
          if (type == 0) {
            psVar10 = (string *)Imf_3_4::Header::channels();
            Imf_3_4::Channel::Channel(local_1f0,UINT,1,1,false);
            Imf_3_4::ChannelList::insert(psVar10,(Channel *)&frameBuffer);
          }
          if (type == 1) {
            psVar10 = (string *)Imf_3_4::Header::channels();
            Imf_3_4::Channel::Channel(local_1f0,HALF,1,1,false);
            Imf_3_4::ChannelList::insert(psVar10,(Channel *)&frameBuffer);
          }
          if (type == 2) {
            psVar10 = (string *)Imf_3_4::Header::channels();
            Imf_3_4::Channel::Channel(local_1f0,FLOAT,1,1,false);
            Imf_3_4::ChannelList::insert(psVar10,(Channel *)&frameBuffer);
          }
          if (DAT_001eb118._M_current == DAT_001eb120) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&(anonymous_namespace)::channelTypes,
                       DAT_001eb118,&type);
          }
          else {
            *DAT_001eb118._M_current = type;
            DAT_001eb118._M_current = DAT_001eb118._M_current + 1;
          }
          if ((_Base_ptr *)frameBuffer._map._M_t._M_impl._0_8_ !=
              &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
            operator_delete((void *)frameBuffer._map._M_t._M_impl._0_8_,
                            (ulong)((long)&(frameBuffer._map._M_t._M_impl.super__Rb_tree_header.
                                            _M_header._M_parent)->_M_color + 1));
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
          std::ios_base::~ios_base(aiStack_138);
          iVar23 = iVar23 + 1;
        } while (channelCount != iVar23);
      }
      Imf_3_4::Header::setType((string *)(anonymous_namespace)::header);
      Imf_3_4::Array<Imf_3_4::Array2D<void_*>_>::Array(&data,(long)size);
      if (0 < channelCount) {
        lVar33 = 0;
        do {
          pAVar6 = data._data;
          pvVar11 = operator_new__(0xf5e20);
          pvVar12 = *(void **)((long)&pAVar6->_data + lVar33);
          if (pvVar12 != (void *)0x0) {
            operator_delete__(pvVar12);
          }
          *(undefined8 *)((long)&pAVar6->_sizeX + lVar33) = 0xea;
          *(undefined8 *)((long)&pAVar6->_sizeY + lVar33) = 0x21a;
          *(void **)((long)&pAVar6->_data + lVar33) = pvVar11;
          lVar33 = lVar33 + 0x18;
        } while ((long)size * 0x18 != lVar33);
      }
      pvVar12 = operator_new__(0x7af10);
      if ((anonymous_namespace)::sampleCount._16_8_ != 0) {
        operator_delete__((void *)(anonymous_namespace)::sampleCount._16_8_);
      }
      (anonymous_namespace)::sampleCount._0_8_ = 0xea;
      (anonymous_namespace)::sampleCount._8_8_ = 0x21a;
      (anonymous_namespace)::sampleCount._16_8_ = pvVar12;
      remove(source_filename._M_dataplus._M_p);
      Imf_3_4::DeepScanLineOutputFile::DeepScanLineOutputFile
                (&file,source_filename._M_dataplus._M_p,(Header *)(anonymous_namespace)::header,8);
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_4::Slice::Slice(&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
      Imf_3_4::Slice::Slice
                ((Slice *)&ss,UINT,
                 (char *)((anonymous_namespace)::sampleCount._16_8_ +
                          (long)(anonymous_namespace)::dataWindow * -4 + (long)DAT_001eb0f4 * -0x868
                         ),4,0x868,1,1,0.0,false,false);
      Imf_3_4::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
      if (0 < channelCount) {
        lVar33 = 0x10;
        p_Var24 = (_Base_ptr)0x0;
        do {
          PVar3 = (anonymous_namespace)::channelTypes[(long)p_Var24];
          PVar5 = (uint)(PVar3 != UINT) * 3;
          if (PVar3 == HALF) {
            PVar5 = PVar3;
          }
          if (PVar3 == FLOAT) {
            PVar5 = PVar3;
          }
          std::__cxx11::stringstream::stringstream((stringstream *)&ss);
          std::ostream::operator<<(local_1a8,(int)p_Var24);
          std::__cxx11::stringbuf::str();
          iVar23 = (anonymous_namespace)::channelTypes[(long)p_Var24];
          uVar30 = (ulong)(iVar23 == 0) << 2;
          if (iVar23 == 1) {
            uVar30 = 2;
          }
          if (iVar23 == 2) {
            uVar30 = 4;
          }
          Imf_3_4::DeepSlice::DeepSlice
                    ((DeepSlice *)local_1f0,PVar5,
                     (char *)(*(long *)((long)&(data._data)->_sizeX + lVar33) +
                              (long)(anonymous_namespace)::dataWindow * -8 +
                             (long)DAT_001eb0f4 * -0x10d0),8,0x10d0,uVar30,1,1,0.0,false,false);
          Imf_3_4::DeepFrameBuffer::insert((string *)&frameBuffer,(DeepSlice *)&type);
          if ((_Base_ptr *)CONCAT44(uStack_2f4,type) != &local_2e8) {
            operator_delete((_Base_ptr *)CONCAT44(uStack_2f4,type),
                            (ulong)((long)&local_2e8->_M_color + 1));
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
          std::ios_base::~ios_base(aiStack_138);
          p_Var24 = (_Base_ptr)((long)&p_Var24->_M_color + 1);
          lVar33 = lVar33 + 0x18;
        } while (size != p_Var24);
      }
      Imf_3_4::DeepScanLineOutputFile::setFrameBuffer((DeepFrameBuffer *)&file);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      lVar33 = 0;
      do {
        lVar34 = 0;
        do {
          iVar23 = random_int(10);
          lVar35 = (anonymous_namespace)::sampleCount._16_8_;
          uVar30 = (ulong)(iVar23 + 1U);
          lVar31 = (anonymous_namespace)::sampleCount._8_8_ * lVar33;
          *(uint *)((anonymous_namespace)::sampleCount._16_8_ + lVar31 * 4 + lVar34 * 4) =
               iVar23 + 1U;
          if (0 < channelCount) {
            uVar32 = (uint)((int)lVar34 + (int)lVar33 * 0x21a) % 0x801;
            fVar36 = (float)uVar32;
            uVar26 = (uint)fVar36 & 0x7fffff | 0x800000;
            cVar8 = (char)((uint)fVar36 >> 0x17);
            uVar28 = (uint)fVar36 >> 0xd & 0x3ff;
            uVar27 = (ushort)uVar28 | 0x7c00 | (ushort)(uVar28 == 0);
            uVar25 = (ushort)((int)fVar36 + 0x8000fff + (uint)(((uint)fVar36 >> 0xd & 1) != 0) >>
                             0xd);
            if (0x477fefff < (uint)fVar36) {
              uVar25 = 0x7c00;
            }
            if (fVar36 == INFINITY) {
              uVar27 = 0x7c00;
            }
            if ((uint)fVar36 < 0x7f800000) {
              uVar27 = uVar25;
            }
            uVar25 = (ushort)(0x80000000 < uVar26 << (cVar8 + 0xa2U & 0x1f)) +
                     (short)(uVar26 >> (0x7eU - cVar8 & 0x1f));
            if ((uint)fVar36 < 0x33000001) {
              uVar25 = 0;
            }
            if (0x387fffff < (uint)fVar36) {
              uVar25 = uVar27;
            }
            p_Var24 = (_Base_ptr)0x0;
            piVar18 = (anonymous_namespace)::channelTypes;
            do {
              iVar23 = piVar18[(long)p_Var24];
              if (iVar23 == 0) {
                pvVar12 = operator_new__(uVar30 << 2);
                data._data[(long)p_Var24]._data[data._data[(long)p_Var24]._sizeY * lVar33 + lVar34]
                     = pvVar12;
                iVar23 = (anonymous_namespace)::channelTypes[(long)p_Var24];
                piVar18 = (anonymous_namespace)::channelTypes;
                lVar35 = (anonymous_namespace)::sampleCount._16_8_;
              }
              if (iVar23 == 1) {
                pvVar12 = operator_new__((ulong)*(uint *)(lVar35 + lVar31 * 4 + lVar34 * 4) * 2);
                data._data[(long)p_Var24]._data[data._data[(long)p_Var24]._sizeY * lVar33 + lVar34]
                     = pvVar12;
                iVar23 = (anonymous_namespace)::channelTypes[(long)p_Var24];
                piVar18 = (anonymous_namespace)::channelTypes;
                lVar35 = (anonymous_namespace)::sampleCount._16_8_;
              }
              if (iVar23 == 2) {
                pvVar12 = operator_new__((ulong)*(uint *)(lVar35 + lVar31 * 4 + lVar34 * 4) << 2);
                data._data[(long)p_Var24]._data[data._data[(long)p_Var24]._sizeY * lVar33 + lVar34]
                     = pvVar12;
                piVar18 = (anonymous_namespace)::channelTypes;
                lVar35 = (anonymous_namespace)::sampleCount._16_8_;
              }
              lVar1 = lVar35 + lVar31 * 4;
              if (*(int *)(lVar1 + lVar34 * 4) == 0) {
                uVar30 = 0;
              }
              else {
                iVar23 = piVar18[(long)p_Var24];
                uVar29 = 0;
                do {
                  if (iVar23 == 0) {
                    *(uint *)((long)data._data[(long)p_Var24]._data
                                    [data._data[(long)p_Var24]._sizeY * lVar33 + lVar34] +
                             uVar29 * 4) = uVar32;
                    iVar23 = piVar18[(long)p_Var24];
                  }
                  if (iVar23 == 2) {
                    *(float *)((long)data._data[(long)p_Var24]._data
                                     [data._data[(long)p_Var24]._sizeY * lVar33 + lVar34] +
                              uVar29 * 4) = fVar36;
                  }
                  else if (iVar23 == 1) {
                    *(ushort *)
                     ((long)data._data[(long)p_Var24]._data
                            [data._data[(long)p_Var24]._sizeY * lVar33 + lVar34] + uVar29 * 2) =
                         uVar25;
                  }
                  uVar29 = uVar29 + 1;
                  uVar30 = (ulong)*(uint *)(lVar1 + lVar34 * 4);
                } while (uVar29 < uVar30);
              }
              p_Var24 = (_Base_ptr)((long)&p_Var24->_M_color + 1);
            } while (p_Var24 != size);
          }
          lVar34 = lVar34 + 1;
        } while (lVar34 != 0x21a);
        lVar33 = lVar33 + 1;
      } while (lVar33 != 0xea);
      Imf_3_4::DeepScanLineOutputFile::writePixels((int)&file);
      lVar33 = 0;
      do {
        lVar34 = 0;
        do {
          if (0 < channelCount) {
            lVar35 = 4;
            p_Var24 = (_Base_ptr)0x0;
            piVar18 = (anonymous_namespace)::channelTypes;
            do {
              iVar23 = piVar18[(long)p_Var24];
              if (iVar23 == 0) {
                pvVar12 = *(void **)(*(long *)((long)data._data + lVar35 * 4 + -8) * lVar33 * 8 +
                                     *(long *)((long)&(data._data)->_sizeX + lVar35 * 4) +
                                    lVar34 * 8);
                if (pvVar12 != (void *)0x0) {
                  operator_delete__(pvVar12);
                  iVar23 = (anonymous_namespace)::channelTypes[(long)p_Var24];
                  piVar18 = (anonymous_namespace)::channelTypes;
                  goto LAB_00146c11;
                }
              }
              else {
LAB_00146c11:
                if (iVar23 == 1) {
                  pvVar12 = *(void **)(*(long *)((long)data._data + lVar35 * 4 + -8) * lVar33 * 8 +
                                       *(long *)((long)&(data._data)->_sizeX + lVar35 * 4) +
                                      lVar34 * 8);
                  if (pvVar12 == (void *)0x0) goto LAB_00146c7b;
                  operator_delete__(pvVar12);
                  iVar23 = (anonymous_namespace)::channelTypes[(long)p_Var24];
                  piVar18 = (anonymous_namespace)::channelTypes;
                }
                if ((iVar23 == 2) &&
                   (pvVar12 = *(void **)(*(long *)((long)data._data + lVar35 * 4 + -8) * lVar33 * 8
                                         + *(long *)((long)&(data._data)->_sizeX + lVar35 * 4) +
                                        lVar34 * 8), pvVar12 != (void *)0x0)) {
                  operator_delete__(pvVar12);
                  piVar18 = (anonymous_namespace)::channelTypes;
                }
              }
LAB_00146c7b:
              p_Var24 = (_Base_ptr)((long)&p_Var24->_M_color + 1);
              lVar35 = lVar35 + 6;
            } while (size != p_Var24);
          }
          lVar34 = lVar34 + 1;
        } while (lVar34 != 0x21a);
        lVar33 = lVar33 + 1;
      } while (lVar33 != 0xea);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
                   *)&frameBuffer);
      Imf_3_4::DeepScanLineOutputFile::~DeepScanLineOutputFile(&file);
      Imf_3_4::Array<Imf_3_4::Array2D<void_*>_>::~Array(&data);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"copying ",8);
      std::ostream::flush();
      Imf_3_4::DeepScanLineInputFile::DeepScanLineInputFile
                ((DeepScanLineInputFile *)&ss,source_filename._M_dataplus._M_p,8);
      remove(copy_filename._M_dataplus._M_p);
      _Var7 = copy_filename._M_dataplus;
      pHVar13 = (Header *)Imf_3_4::DeepScanLineInputFile::header();
      uVar22 = 8;
      Imf_3_4::DeepScanLineOutputFile::DeepScanLineOutputFile
                ((DeepScanLineOutputFile *)&frameBuffer,_Var7._M_p,pHVar13,8);
      Imf_3_4::DeepScanLineOutputFile::copyPixels((DeepScanLineInputFile *)&frameBuffer);
      Imf_3_4::DeepScanLineOutputFile::~DeepScanLineOutputFile
                ((DeepScanLineOutputFile *)&frameBuffer);
      if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0);
      }
      if (local_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b0);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      Imf_3_4::DeepScanLineInputFile::DeepScanLineInputFile
                ((DeepScanLineInputFile *)&type,copy_filename._M_dataplus._M_p,8);
      Imf_3_4::DeepScanLineInputFile::header();
      puVar14 = (undefined8 *)Imf_3_4::Header::displayWindow();
      puVar15 = (undefined8 *)Imf_3_4::Header::displayWindow();
      iVar23 = -(uint)((int)*puVar15 == (int)*puVar14);
      iVar41 = -(uint)((int)((ulong)*puVar15 >> 0x20) == (int)((ulong)*puVar14 >> 0x20));
      auVar37._4_4_ = iVar23;
      auVar37._0_4_ = iVar23;
      auVar37._8_4_ = iVar41;
      auVar37._12_4_ = iVar41;
      iVar23 = movmskpd(uVar22,auVar37);
      if ((iVar23 != 3) ||
         (iVar41 = -(uint)((int)puVar15[1] == (int)puVar14[1]),
         iVar42 = -(uint)((int)((ulong)puVar15[1] >> 0x20) == (int)((ulong)puVar14[1] >> 0x20)),
         auVar38._4_4_ = iVar41, auVar38._0_4_ = iVar41, auVar38._8_4_ = iVar42,
         auVar38._12_4_ = iVar42, iVar41 = movmskpd((int)puVar15,auVar38), iVar41 != 3)) {
        __assert_fail("fileHeader.displayWindow () == header.displayWindow ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                      ,0xcf,"void (anonymous namespace)::readFile(const std::string &, int)");
      }
      puVar14 = (undefined8 *)Imf_3_4::Header::dataWindow();
      puVar15 = (undefined8 *)Imf_3_4::Header::dataWindow();
      iVar41 = -(uint)((int)*puVar15 == (int)*puVar14);
      iVar42 = -(uint)((int)((ulong)*puVar15 >> 0x20) == (int)((ulong)*puVar14 >> 0x20));
      auVar39._4_4_ = iVar41;
      auVar39._0_4_ = iVar41;
      auVar39._8_4_ = iVar42;
      auVar39._12_4_ = iVar42;
      iVar23 = movmskpd(iVar23,auVar39);
      if ((iVar23 != 3) ||
         (iVar23 = -(uint)((int)puVar15[1] == (int)puVar14[1]),
         iVar41 = -(uint)((int)((ulong)puVar15[1] >> 0x20) == (int)((ulong)puVar14[1] >> 0x20)),
         auVar40._4_4_ = iVar23, auVar40._0_4_ = iVar23, auVar40._8_4_ = iVar41,
         auVar40._12_4_ = iVar41, iVar23 = movmskpd((int)puVar15,auVar40), iVar23 != 3)) {
        __assert_fail("fileHeader.dataWindow () == header.dataWindow ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                      ,0xd0,"void (anonymous namespace)::readFile(const std::string &, int)");
      }
      pfVar16 = (float *)Imf_3_4::Header::pixelAspectRatio();
      fVar36 = *pfVar16;
      pfVar16 = (float *)Imf_3_4::Header::pixelAspectRatio();
      if ((fVar36 != *pfVar16) || (NAN(fVar36) || NAN(*pfVar16))) {
        __assert_fail("fileHeader.pixelAspectRatio () == header.pixelAspectRatio ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                      ,0xd1,"void (anonymous namespace)::readFile(const std::string &, int)");
      }
      pfVar16 = (float *)Imf_3_4::Header::screenWindowCenter();
      pfVar17 = (float *)Imf_3_4::Header::screenWindowCenter();
      if ((((*pfVar16 != *pfVar17) || (NAN(*pfVar16) || NAN(*pfVar17))) ||
          (pfVar16[1] != pfVar17[1])) || (NAN(pfVar16[1]) || NAN(pfVar17[1]))) {
        __assert_fail("fileHeader.screenWindowCenter () == header.screenWindowCenter ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                      ,0xd2,"void (anonymous namespace)::readFile(const std::string &, int)");
      }
      pfVar16 = (float *)Imf_3_4::Header::screenWindowWidth();
      fVar36 = *pfVar16;
      pfVar16 = (float *)Imf_3_4::Header::screenWindowWidth();
      if ((fVar36 != *pfVar16) || (NAN(fVar36) || NAN(*pfVar16))) {
        __assert_fail("fileHeader.screenWindowWidth () == header.screenWindowWidth ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                      ,0xd3,"void (anonymous namespace)::readFile(const std::string &, int)");
      }
      piVar18 = (int *)Imf_3_4::Header::lineOrder();
      iVar23 = *piVar18;
      piVar18 = (int *)Imf_3_4::Header::lineOrder();
      if (iVar23 != *piVar18) {
        __assert_fail("fileHeader.lineOrder () == header.lineOrder ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                      ,0xd4,"void (anonymous namespace)::readFile(const std::string &, int)");
      }
      piVar18 = (int *)Imf_3_4::Header::compression();
      iVar23 = *piVar18;
      piVar18 = (int *)Imf_3_4::Header::compression();
      if (iVar23 != *piVar18) {
        __assert_fail("fileHeader.compression () == header.compression ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                      ,0xd5,"void (anonymous namespace)::readFile(const std::string &, int)");
      }
      this = (ChannelList *)Imf_3_4::Header::channels();
      pCVar19 = (ChannelList *)Imf_3_4::Header::channels();
      cVar8 = Imf_3_4::ChannelList::operator==(this,pCVar19);
      if (cVar8 == '\0') {
        __assert_fail("fileHeader.channels () == header.channels ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                      ,0xd6,"void (anonymous namespace)::readFile(const std::string &, int)");
      }
      puVar14 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
      puVar15 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
      __n = puVar14[1];
      if ((__n != puVar15[1]) ||
         ((__n != 0 && (iVar23 = bcmp((void *)*puVar14,(void *)*puVar15,__n), iVar23 != 0)))) {
        __assert_fail("fileHeader.type () == header.type ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                      ,0xd7,"void (anonymous namespace)::readFile(const std::string &, int)");
      }
      pvVar12 = operator_new__(0x7af10);
      Imf_3_4::Array<Imf_3_4::Array2D<void_*>_>::Array
                ((Array<Imf_3_4::Array2D<void_*>_> *)&file,(long)size);
      if (0 < channelCount) {
        lVar33 = 0;
        do {
          pvVar20 = operator_new__(0xf5e20);
          pvVar11 = *(void **)((long)&local_328->_data + lVar33);
          if (pvVar11 != (void *)0x0) {
            operator_delete__(pvVar11);
          }
          *(undefined8 *)((long)&local_328->_sizeX + lVar33) = 0xea;
          *(undefined8 *)((long)&local_328->_sizeY + lVar33) = 0x21a;
          *(void **)((long)&local_328->_data + lVar33) = pvVar20;
          lVar33 = lVar33 + 0x18;
        } while ((long)size * 0x18 != lVar33);
      }
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_4::Slice::Slice(&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
      Imf_3_4::Slice::Slice
                ((Slice *)&ss,UINT,
                 (char *)((long)pvVar12 +
                         (long)DAT_001eb0f4 * -0x868 + (long)(anonymous_namespace)::dataWindow * -4)
                 ,4,0x868,1,1,0.0,false,false);
      Imf_3_4::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
      if (0 < channelCount) {
        lVar33 = 0x10;
        p_Var24 = (_Base_ptr)0x0;
        do {
          PVar3 = (anonymous_namespace)::channelTypes[(long)p_Var24];
          PVar5 = (uint)(PVar3 != UINT) * 3;
          if (PVar3 == HALF) {
            PVar5 = PVar3;
          }
          if (PVar3 == FLOAT) {
            PVar5 = PVar3;
          }
          std::__cxx11::stringstream::stringstream((stringstream *)&ss);
          std::ostream::operator<<(local_1a8,(int)p_Var24);
          std::__cxx11::stringbuf::str();
          iVar23 = (anonymous_namespace)::channelTypes[(long)p_Var24];
          uVar30 = (ulong)(iVar23 == 0) << 2;
          if (iVar23 == 1) {
            uVar30 = 2;
          }
          if (iVar23 == 2) {
            uVar30 = 4;
          }
          Imf_3_4::DeepSlice::DeepSlice
                    ((DeepSlice *)local_1f0,PVar5,
                     (char *)(*(long *)((long)&local_328->_sizeX + lVar33) +
                              (long)(anonymous_namespace)::dataWindow * -8 +
                             (long)DAT_001eb0f4 * -0x10d0),8,0x10d0,uVar30,1,1,0.0,false,false);
          Imf_3_4::DeepFrameBuffer::insert((string *)&frameBuffer,(DeepSlice *)&data);
          if ((long *)data._size != local_2c0) {
            operator_delete((void *)data._size,local_2c0[0] + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
          std::ios_base::~ios_base(aiStack_138);
          p_Var24 = (_Base_ptr)((long)&p_Var24->_M_color + 1);
          lVar33 = lVar33 + 0x18;
        } while (size != p_Var24);
      }
      Imf_3_4::DeepScanLineInputFile::setFrameBuffer((DeepFrameBuffer *)&type);
      Imf_3_4::DeepScanLineInputFile::readPixelSampleCounts
                ((int)(DeepFrameBuffer *)&type,DAT_001eb0f4);
      iVar23 = DAT_001eb0f4;
      local_2b0 = CONCAT44(local_2b0._4_4_,DAT_001eb0fc);
      iVar41 = DAT_001eb0fc - DAT_001eb0f4;
      if (DAT_001eb0f4 <= DAT_001eb0fc) {
        local_2d8 = (_Base_ptr)((anonymous_namespace)::sampleCount._8_8_ << 2);
        lVar33 = 0;
        uVar30 = 0;
        pvVar11 = pvVar12;
        do {
          lVar34 = 0;
          do {
            if (*(int *)((long)pvVar11 + lVar34 * 4) !=
                *(int *)((anonymous_namespace)::sampleCount._16_8_ + lVar33 + lVar34 * 4)) {
              __assert_fail("localSampleCount[i][j] == sampleCount[i][j]",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                            ,0x10b,"void (anonymous namespace)::readFile(const std::string &, int)")
              ;
            }
            lVar34 = lVar34 + 1;
          } while (lVar34 != 0x21a);
          lVar34 = 0;
          do {
            if (0 < channelCount) {
              lVar35 = 4;
              p_Var24 = (_Base_ptr)0x0;
              piVar18 = (anonymous_namespace)::channelTypes;
              do {
                iVar42 = piVar18[(long)p_Var24];
                if (iVar42 == 0) {
                  pvVar20 = operator_new__((ulong)*(uint *)((long)pvVar12 +
                                                           lVar34 * 4 + uVar30 * 0x868) << 2);
                  *(void **)(*(long *)((long)local_328 + lVar35 * 4 + -8) * uVar30 * 8 +
                             *(long *)((long)&local_328->_sizeX + lVar35 * 4) + lVar34 * 8) =
                       pvVar20;
                  iVar42 = (anonymous_namespace)::channelTypes[(long)p_Var24];
                  piVar18 = (anonymous_namespace)::channelTypes;
                }
                if (iVar42 == 1) {
                  pvVar20 = operator_new__((ulong)*(uint *)((long)pvVar12 +
                                                           lVar34 * 4 + uVar30 * 0x868) * 2);
                  *(void **)(*(long *)((long)local_328 + lVar35 * 4 + -8) * uVar30 * 8 +
                             *(long *)((long)&local_328->_sizeX + lVar35 * 4) + lVar34 * 8) =
                       pvVar20;
                  iVar42 = (anonymous_namespace)::channelTypes[(long)p_Var24];
                  piVar18 = (anonymous_namespace)::channelTypes;
                }
                if (iVar42 == 2) {
                  pvVar20 = operator_new__((ulong)*(uint *)((long)pvVar12 +
                                                           lVar34 * 4 + uVar30 * 0x868) << 2);
                  *(void **)(*(long *)((long)local_328 + lVar35 * 4 + -8) * uVar30 * 8 +
                             *(long *)((long)&local_328->_sizeX + lVar35 * 4) + lVar34 * 8) =
                       pvVar20;
                  piVar18 = (anonymous_namespace)::channelTypes;
                }
                p_Var24 = (_Base_ptr)((long)&p_Var24->_M_color + 1);
                lVar35 = lVar35 + 6;
              } while (size != p_Var24);
            }
            lVar34 = lVar34 + 1;
          } while (lVar34 != 0x21a);
          uVar30 = uVar30 + 1;
          lVar33 = (long)&local_2d8->_M_color + lVar33;
          pvVar11 = (void *)((long)pvVar11 + 0x868);
        } while (uVar30 != iVar41 + 1);
      }
      Imf_3_4::DeepScanLineInputFile::readPixels((int)&type,iVar23);
      lVar33 = 0;
      do {
        local_2b0 = lVar33 * 0x21a;
        lVar34 = 0;
        do {
          if (0 < channelCount) {
            iVar23 = (int)lVar34;
            uVar26 = (uint)(iVar23 + (int)local_2b0) % 0x801;
            fVar36 = (float)uVar26;
            p_Var24 = (_Base_ptr)0x0;
            lVar35 = (anonymous_namespace)::sampleCount._16_8_;
            lVar31 = (anonymous_namespace)::sampleCount._8_8_;
            do {
              if (*(int *)(lVar35 + lVar31 * lVar33 * 4 + lVar34 * 4) != 0) {
                uVar30 = 0;
                local_2d8 = p_Var24;
                do {
                  iVar41 = (anonymous_namespace)::channelTypes[(long)p_Var24];
                  iVar42 = (int)lVar33;
                  if (iVar41 == 0) {
                    pvVar11 = local_328[(long)p_Var24]._data
                              [local_328[(long)p_Var24]._sizeY * lVar33 + lVar34];
                    if (*(uint *)((long)pvVar11 + uVar30 * 4) != uVar26) {
                      poVar9 = (ostream *)std::ostream::operator<<(&std::cout,iVar23);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
                      poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar42);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar9," error, should be ",0x12);
                      poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar26);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", is ",5);
                      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9)
                      ;
                      std::ostream::put((char)poVar9);
                      std::ostream::flush();
                      std::ostream::flush();
                      if (*(uint *)((long)pvVar11 + uVar30 * 4) != uVar26) {
                        __assert_fail("value[l] == static_cast<unsigned int> (i * width + j) % 2049"
                                      ,
                                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                                      ,0x12e,
                                      "void (anonymous namespace)::readFile(const std::string &, int)"
                                     );
                      }
                      iVar41 = (anonymous_namespace)::channelTypes[(long)p_Var24];
                      goto LAB_001475a6;
                    }
                  }
                  else {
LAB_001475a6:
                    if (iVar41 == 1) {
                      pvVar11 = local_328[(long)p_Var24]._data
                                [local_328[(long)p_Var24]._sizeY * lVar33 + lVar34];
                      fVar2 = *(float *)(_imath_half_to_float_table +
                                        (ulong)*(ushort *)((long)pvVar11 + uVar30 * 2) * 4);
                      if ((fVar2 != fVar36) || (NAN(fVar2) || NAN(fVar36))) {
                        poVar9 = (ostream *)std::ostream::operator<<(&std::cout,iVar23);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
                        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar42);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar9," error, should be ",0x12);
                        poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar26);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar9,", is ",5);
                        plVar21 = (long *)::operator<<(poVar9,(half)*(uint16_t *)
                                                                     ((long)pvVar11 + uVar30 * 2));
                        std::ios::widen((char)*(undefined8 *)(*plVar21 + -0x18) + (char)plVar21);
                        std::ostream::put((char)plVar21);
                        std::ostream::flush();
                        std::ostream::flush();
                        fVar2 = *(float *)(_imath_half_to_float_table +
                                          (ulong)*(ushort *)
                                                  ((long)local_328[(long)p_Var24]._data
                                                         [local_328[(long)p_Var24]._sizeY * lVar33 +
                                                          lVar34] + uVar30 * 2) * 4);
                      }
                      if ((fVar2 != fVar36) || (NAN(fVar2) || NAN(fVar36))) {
                        __assert_fail("((half*) (data[k][i][j]))[l] == (i * width + j) % 2049",
                                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                                      ,0x13b,
                                      "void (anonymous namespace)::readFile(const std::string &, int)"
                                     );
                      }
                      iVar41 = (anonymous_namespace)::channelTypes[(long)local_2d8];
                      p_Var24 = local_2d8;
                    }
                    if (iVar41 == 2) {
                      pvVar11 = local_328[(long)p_Var24]._data
                                [local_328[(long)p_Var24]._sizeY * lVar33 + lVar34];
                      fVar2 = *(float *)((long)pvVar11 + uVar30 * 4);
                      if ((fVar2 != fVar36) || (NAN(fVar2) || NAN(fVar36))) {
                        poVar9 = (ostream *)std::ostream::operator<<(&std::cout,iVar23);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
                        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar42);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar9," error, should be ",0x12);
                        poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar26);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar9,", is ",5);
                        poVar9 = std::ostream::_M_insert<double>
                                           ((double)*(float *)((long)pvVar11 + uVar30 * 4));
                        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) +
                                        (char)poVar9);
                        std::ostream::put((char)poVar9);
                        std::ostream::flush();
                        std::ostream::flush();
                        fVar2 = *(float *)((long)local_328[(long)p_Var24]._data
                                                 [local_328[(long)p_Var24]._sizeY * lVar33 + lVar34]
                                          + uVar30 * 4);
                      }
                      if ((fVar2 != fVar36) || (p_Var24 = local_2d8, NAN(fVar2) || NAN(fVar36))) {
                        __assert_fail("((float*) (data[k][i][j]))[l] == (i * width + j) % 2049",
                                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                                      ,0x147,
                                      "void (anonymous namespace)::readFile(const std::string &, int)"
                                     );
                      }
                    }
                  }
                  uVar30 = uVar30 + 1;
                  lVar35 = (anonymous_namespace)::sampleCount._16_8_;
                  lVar31 = (anonymous_namespace)::sampleCount._8_8_;
                } while (uVar30 < *(uint *)((anonymous_namespace)::sampleCount._16_8_ +
                                            (anonymous_namespace)::sampleCount._8_8_ * lVar33 * 4 +
                                           lVar34 * 4));
              }
              p_Var24 = (_Base_ptr)((long)&p_Var24->_M_color + 1);
            } while (p_Var24 != size);
          }
          lVar34 = lVar34 + 1;
        } while (lVar34 != 0x21a);
        lVar33 = lVar33 + 1;
      } while (lVar33 != 0xea);
      lVar33 = 0;
      do {
        lVar34 = 0;
        do {
          if (0 < channelCount) {
            lVar35 = 4;
            p_Var24 = (_Base_ptr)0x0;
            piVar18 = (anonymous_namespace)::channelTypes;
            do {
              iVar23 = piVar18[(long)p_Var24];
              if (iVar23 == 0) {
                pvVar11 = *(void **)(*(long *)((long)local_328 + lVar35 * 4 + -8) * lVar33 * 8 +
                                     *(long *)((long)&local_328->_sizeX + lVar35 * 4) + lVar34 * 8);
                if (pvVar11 != (void *)0x0) {
                  operator_delete__(pvVar11);
                  iVar23 = (anonymous_namespace)::channelTypes[(long)p_Var24];
                  piVar18 = (anonymous_namespace)::channelTypes;
                  goto LAB_001478cb;
                }
              }
              else {
LAB_001478cb:
                if (iVar23 == 1) {
                  pvVar11 = *(void **)(*(long *)((long)local_328 + lVar35 * 4 + -8) * lVar33 * 8 +
                                       *(long *)((long)&local_328->_sizeX + lVar35 * 4) + lVar34 * 8
                                      );
                  if (pvVar11 == (void *)0x0) goto LAB_0014792f;
                  operator_delete__(pvVar11);
                  iVar23 = (anonymous_namespace)::channelTypes[(long)p_Var24];
                  piVar18 = (anonymous_namespace)::channelTypes;
                }
                if ((iVar23 == 2) &&
                   (pvVar11 = *(void **)(*(long *)((long)local_328 + lVar35 * 4 + -8) * lVar33 * 8 +
                                         *(long *)((long)&local_328->_sizeX + lVar35 * 4) +
                                        lVar34 * 8), pvVar11 != (void *)0x0)) {
                  operator_delete__(pvVar11);
                  piVar18 = (anonymous_namespace)::channelTypes;
                }
              }
LAB_0014792f:
              p_Var24 = (_Base_ptr)((long)&p_Var24->_M_color + 1);
              lVar35 = lVar35 + 6;
            } while (size != p_Var24);
          }
          lVar34 = lVar34 + 1;
        } while (lVar34 != 0x21a);
        lVar33 = lVar33 + 1;
      } while (lVar33 != 0xea);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
                   *)&frameBuffer);
      Imf_3_4::Array<Imf_3_4::Array2D<void_*>_>::~Array((Array<Imf_3_4::Array2D<void_*>_> *)&file);
      operator_delete__(pvVar12);
      if (local_2e0 != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0);
      }
      if (local_2f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2f0);
      }
      remove(source_filename._M_dataplus._M_p);
      remove(copy_filename._M_dataplus._M_p);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      std::ostream::flush();
      local_314 = local_314 + 1;
    } while (local_314 != testTimes);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)copy_filename._M_dataplus._M_p != &copy_filename.field_2) {
    operator_delete(copy_filename._M_dataplus._M_p,copy_filename.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)source_filename._M_dataplus._M_p != &source_filename.field_2) {
    operator_delete(source_filename._M_dataplus._M_p,
                    source_filename.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
readCopyWriteTest (const std::string& tempDir, int channelCount, int testTimes)
{
    cout << "Testing files with " << channelCount << " channels " << testTimes
         << " times." << endl
         << flush;

    std::string source_filename =
        tempDir + "imf_test_copy_deep_scanline_source.exr";
    std::string copy_filename =
        tempDir + "imf_test_copy_deep_scanline_copy.exr";

    for (int i = 0; i < testTimes; i++)
    {
        int         compressionIndex = i % 3;
        Compression compression;
        switch (compressionIndex)
        {
            case 0: compression = NO_COMPRESSION; break;
            case 1: compression = RLE_COMPRESSION; break;
            case 2: compression = ZIPS_COMPRESSION; break;
        }

        generateRandomFile (source_filename, channelCount, compression);
        copyFile (source_filename, copy_filename);
        readFile (copy_filename, channelCount);
        remove (source_filename.c_str ());
        remove (copy_filename.c_str ());
        cout << endl << flush;
    }
}